

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint32_t helper_neon_unarrow_sat32_arm(CPUARMState *env,uint64_t x)

{
  uint64_t x_local;
  CPUARMState *env_local;
  
  if ((x & 0x8000000000000000) == 0) {
    if (x < 0x100000000) {
      env_local._4_4_ = (uint32_t)x;
    }
    else {
      (env->vfp).qc[0] = 1;
      env_local._4_4_ = 0xffffffff;
    }
  }
  else {
    (env->vfp).qc[0] = 1;
    env_local._4_4_ = 0;
  }
  return env_local._4_4_;
}

Assistant:

uint32_t HELPER(neon_unarrow_sat32)(CPUARMState *env, uint64_t x)
{
    if (x & 0x8000000000000000ull) {
        SET_QC();
        return 0;
    }
    if (x > 0xffffffffu) {
        SET_QC();
        return 0xffffffffu;
    }
    return x;
}